

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.h
# Opt level: O3

int __thiscall ZXing::Pdf417::BarcodeMatrix::init(BarcodeMatrix *this,EVP_PKEY_CTX *ctx)

{
  pointer pBVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int in_EDX;
  long lVar3;
  
  std::vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>::resize
            (&this->_matrix,(long)(int)ctx);
  iVar2 = extraout_EAX;
  if (0 < (int)ctx) {
    lVar3 = 0;
    do {
      pBVar1 = (this->_matrix).
               super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(pBVar1->_row).super__Bvector_base<std::allocator<bool>_> + lVar3),
                 (long)(in_EDX * 0x11 + 0x45),false);
      *(undefined4 *)((long)&pBVar1->_currentLocation + lVar3) = 0;
      lVar3 = lVar3 + 0x30;
      iVar2 = extraout_EAX_00;
    } while (((ulong)ctx & 0xffffffff) * 0x30 != lVar3);
  }
  this->_width = in_EDX * 0x11;
  this->_currentRow = -1;
  return iVar2;
}

Assistant:

void init(int height, int width) {
		_matrix.resize(height);
		for (int i = 0; i < height; ++i) {
			_matrix[i].init((width + 4) * 17 + 1);
		}
		_width = width * 17;
		_currentRow = -1;
	}